

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodetype_to_string.cpp
# Opt level: O2

string * __thiscall
duckdb::Transformer::NodetypeToString_abi_cxx11_
          (string *__return_storage_ptr__,Transformer *this,PGNodeTag type)

{
  char *pcVar1;
  allocator local_9;
  
  switch(type) {
  case T_PGInvalid:
    pcVar1 = "T_Invalid";
    break;
  case T_PGIndexInfo:
    pcVar1 = "T_IndexInfo";
    break;
  case T_PGExprContext:
    pcVar1 = "T_ExprContext";
    break;
  case T_PGProjectionInfo:
    pcVar1 = "T_ProjectionInfo";
    break;
  case T_PGJunkFilter:
    pcVar1 = "T_JunkFilter";
    break;
  case T_PGResultRelInfo:
    pcVar1 = "T_ResultRelInfo";
    break;
  case T_PGEState:
    pcVar1 = "T_EState";
    break;
  case T_PGTupleTableSlot:
    pcVar1 = "T_TupleTableSlot";
    break;
  case T_PGPlan:
    pcVar1 = "T_Plan";
    break;
  case T_PGResult:
    pcVar1 = "T_Result";
    break;
  case T_PGProjectSet:
    pcVar1 = "T_ProjectSet";
    break;
  case T_PGModifyTable:
    pcVar1 = "T_ModifyTable";
    break;
  case T_PGAppend:
    pcVar1 = "T_Append";
    break;
  case T_PGMergeAppend:
    pcVar1 = "T_MergeAppend";
    break;
  case T_PGRecursiveUnion:
    pcVar1 = "T_RecursiveUnion";
    break;
  case T_PGBitmapAnd:
    pcVar1 = "T_BitmapAnd";
    break;
  case T_PGBitmapOr:
    pcVar1 = "T_BitmapOr";
    break;
  case T_PGScan:
    pcVar1 = "T_Scan";
    break;
  case T_PGSeqScan:
    pcVar1 = "T_SeqScan";
    break;
  case T_PGSampleScan:
    pcVar1 = "T_SampleScan";
    break;
  case T_PGIndexScan:
    pcVar1 = "T_IndexScan";
    break;
  case T_PGIndexOnlyScan:
    pcVar1 = "T_IndexOnlyScan";
    break;
  case T_PGBitmapIndexScan:
    pcVar1 = "T_BitmapIndexScan";
    break;
  case T_PGBitmapHeapScan:
    pcVar1 = "T_BitmapHeapScan";
    break;
  case T_PGTidScan:
    pcVar1 = "T_TidScan";
    break;
  case T_PGSubqueryScan:
    pcVar1 = "T_SubqueryScan";
    break;
  case T_PGFunctionScan:
    pcVar1 = "T_FunctionScan";
    break;
  case T_PGValuesScan:
    pcVar1 = "T_ValuesScan";
    break;
  case T_PGTableFuncScan:
    pcVar1 = "T_TableFuncScan";
    break;
  case T_PGCteScan:
    pcVar1 = "T_CteScan";
    break;
  case T_PGNamedTuplestoreScan:
    pcVar1 = "T_NamedTuplestoreScan";
    break;
  case T_PGWorkTableScan:
    pcVar1 = "T_WorkTableScan";
    break;
  case T_PGForeignScan:
    pcVar1 = "T_ForeignScan";
    break;
  case T_PGCustomScan:
    pcVar1 = "T_CustomScan";
    break;
  case T_PGJoin:
    pcVar1 = "T_Join";
    break;
  case T_PGNestLoop:
    pcVar1 = "T_NestLoop";
    break;
  case T_PGMergeJoin:
    pcVar1 = "T_MergeJoin";
    break;
  case T_PGHashJoin:
    pcVar1 = "T_HashJoin";
    break;
  case T_PGMaterial:
    pcVar1 = "T_Material";
    break;
  case T_PGSort:
    pcVar1 = "T_Sort";
    break;
  case T_PGGroup:
    pcVar1 = "T_Group";
    break;
  case T_PGAgg:
    pcVar1 = "T_Agg";
    break;
  case T_PGWindowAgg:
    pcVar1 = "T_WindowAgg";
    break;
  case T_PGUnique:
    pcVar1 = "T_Unique";
    break;
  case T_PGGather:
    pcVar1 = "T_Gather";
    break;
  case T_PGGatherMerge:
    pcVar1 = "T_GatherMerge";
    break;
  case T_PGHash:
    pcVar1 = "T_Hash";
    break;
  case T_PGSetOp:
    pcVar1 = "T_SetOp";
    break;
  case T_PGLockRows:
    pcVar1 = "T_LockRows";
    break;
  case T_PGLimit:
    pcVar1 = "T_Limit";
    break;
  case T_PGNestLoopParam:
    pcVar1 = "T_NestLoopParam";
    break;
  case T_PGPlanRowMark:
    pcVar1 = "T_PlanRowMark";
    break;
  case T_PGPlanInvalItem:
    pcVar1 = "T_PlanInvalItem";
    break;
  case T_PGPlanState:
    pcVar1 = "T_PlanState";
    break;
  case T_PGResultState:
    pcVar1 = "T_ResultState";
    break;
  case T_PGProjectSetState:
    pcVar1 = "T_ProjectSetState";
    break;
  case T_PGModifyTableState:
    pcVar1 = "T_ModifyTableState";
    break;
  case T_PGAppendState:
    pcVar1 = "T_AppendState";
    break;
  case T_PGMergeAppendState:
    pcVar1 = "T_MergeAppendState";
    break;
  case T_PGRecursiveUnionState:
    pcVar1 = "T_RecursiveUnionState";
    break;
  case T_PGBitmapAndState:
    pcVar1 = "T_BitmapAndState";
    break;
  case T_PGBitmapOrState:
    pcVar1 = "T_BitmapOrState";
    break;
  case T_PGScanState:
    pcVar1 = "T_ScanState";
    break;
  case T_PGSeqScanState:
    pcVar1 = "T_SeqScanState";
    break;
  case T_PGSampleScanState:
    pcVar1 = "T_SampleScanState";
    break;
  case T_PGIndexScanState:
    pcVar1 = "T_IndexScanState";
    break;
  case T_PGIndexOnlyScanState:
    pcVar1 = "T_IndexOnlyScanState";
    break;
  case T_PGBitmapIndexScanState:
    pcVar1 = "T_BitmapIndexScanState";
    break;
  case T_PGBitmapHeapScanState:
    pcVar1 = "T_BitmapHeapScanState";
    break;
  case T_PGTidScanState:
    pcVar1 = "T_TidScanState";
    break;
  case T_PGSubqueryScanState:
    pcVar1 = "T_SubqueryScanState";
    break;
  case T_PGFunctionScanState:
    pcVar1 = "T_FunctionScanState";
    break;
  case T_PGTableFuncScanState:
    pcVar1 = "T_TableFuncScanState";
    break;
  case T_PGValuesScanState:
    pcVar1 = "T_ValuesScanState";
    break;
  case T_PGCteScanState:
    pcVar1 = "T_CteScanState";
    break;
  case T_PGNamedTuplestoreScanState:
    pcVar1 = "T_NamedTuplestoreScanState";
    break;
  case T_PGWorkTableScanState:
    pcVar1 = "T_WorkTableScanState";
    break;
  case T_PGForeignScanState:
    pcVar1 = "T_ForeignScanState";
    break;
  case T_PGCustomScanState:
    pcVar1 = "T_CustomScanState";
    break;
  case T_PGJoinState:
    pcVar1 = "T_JoinState";
    break;
  case T_PGNestLoopState:
    pcVar1 = "T_NestLoopState";
    break;
  case T_PGMergeJoinState:
    pcVar1 = "T_MergeJoinState";
    break;
  case T_PGHashJoinState:
    pcVar1 = "T_HashJoinState";
    break;
  case T_PGMaterialState:
    pcVar1 = "T_MaterialState";
    break;
  case T_PGSortState:
    pcVar1 = "T_SortState";
    break;
  case T_PGGroupState:
    pcVar1 = "T_GroupState";
    break;
  case T_PGAggState:
    pcVar1 = "T_AggState";
    break;
  case T_PGWindowAggState:
    pcVar1 = "T_WindowAggState";
    break;
  case T_PGUniqueState:
    pcVar1 = "T_UniqueState";
    break;
  case T_PGGatherState:
    pcVar1 = "T_GatherState";
    break;
  case T_PGGatherMergeState:
    pcVar1 = "T_GatherMergeState";
    break;
  case T_PGHashState:
    pcVar1 = "T_HashState";
    break;
  case T_PGSetOpState:
    pcVar1 = "T_SetOpState";
    break;
  case T_PGLockRowsState:
    pcVar1 = "T_LockRowsState";
    break;
  case T_PGLimitState:
    pcVar1 = "T_LimitState";
    break;
  case T_PGAlias:
    pcVar1 = "T_Alias";
    break;
  case T_PGRangeVar:
    pcVar1 = "T_RangeVar";
    break;
  case T_PGTableFunc:
    pcVar1 = "T_TableFunc";
    break;
  case T_PGExpr:
    pcVar1 = "T_Expr";
    break;
  case T_PGVar:
    pcVar1 = "T_Var";
    break;
  case T_PGConst:
    pcVar1 = "T_Const";
    break;
  case T_PGParam:
    pcVar1 = "T_Param";
    break;
  case T_PGAggref:
    pcVar1 = "T_Aggref";
    break;
  case T_PGGroupingFunc:
    pcVar1 = "T_GroupingFunc";
    break;
  case T_PGWindowFunc:
    pcVar1 = "T_WindowFunc";
    break;
  case T_PGArrayRef:
    pcVar1 = "T_ArrayRef";
    break;
  case T_PGFuncExpr:
    pcVar1 = "T_FuncExpr";
    break;
  case T_PGNamedArgExpr:
    pcVar1 = "T_NamedArgExpr";
    break;
  case T_PGOpExpr:
    pcVar1 = "T_OpExpr";
    break;
  case T_PGDistinctExpr:
    pcVar1 = "T_DistinctExpr";
    break;
  case T_PGNullIfExpr:
    pcVar1 = "T_NullIfExpr";
    break;
  case T_PGScalarArrayOpExpr:
    pcVar1 = "T_ScalarArrayOpExpr";
    break;
  case T_PGBoolExpr:
    pcVar1 = "T_BoolExpr";
    break;
  case T_PGSubLink:
    pcVar1 = "T_SubLink";
    break;
  case T_PGSubPlan:
    pcVar1 = "T_SubPlan";
    break;
  case T_PGAlternativeSubPlan:
    pcVar1 = "T_AlternativeSubPlan";
    break;
  case T_PGFieldSelect:
    pcVar1 = "T_FieldSelect";
    break;
  case T_PGFieldStore:
    pcVar1 = "T_FieldStore";
    break;
  case T_PGRelabelType:
    pcVar1 = "T_RelabelType";
    break;
  case T_PGCoerceViaIO:
    pcVar1 = "T_CoerceViaIO";
    break;
  case T_PGArrayCoerceExpr:
    pcVar1 = "T_ArrayCoerceExpr";
    break;
  case T_PGConvertRowtypeExpr:
    pcVar1 = "T_ConvertRowtypeExpr";
    break;
  case T_PGCollateExpr:
    pcVar1 = "T_CollateExpr";
    break;
  case T_PGCaseExpr:
    pcVar1 = "T_CaseExpr";
    break;
  case T_PGCaseWhen:
    pcVar1 = "T_CaseWhen";
    break;
  case T_PGCaseTestExpr:
    pcVar1 = "T_CaseTestExpr";
    break;
  case T_PGArrayExpr:
    pcVar1 = "T_ArrayExpr";
    break;
  case T_PGRowExpr:
    pcVar1 = "T_RowExpr";
    break;
  case T_PGRowCompareExpr:
    pcVar1 = "T_RowCompareExpr";
    break;
  case T_PGCoalesceExpr:
    pcVar1 = "T_CoalesceExpr";
    break;
  case T_PGMinMaxExpr:
    pcVar1 = "T_MinMaxExpr";
    break;
  case T_PGSQLValueFunction:
    pcVar1 = "T_SQLValueFunction";
    break;
  case T_PGXmlExpr:
    pcVar1 = "T_XmlExpr";
    break;
  case T_PGNullTest:
    pcVar1 = "T_NullTest";
    break;
  case T_PGBooleanTest:
    pcVar1 = "T_BooleanTest";
    break;
  case T_PGCoerceToDomain:
    pcVar1 = "T_CoerceToDomain";
    break;
  case T_PGCoerceToDomainValue:
    pcVar1 = "T_CoerceToDomainValue";
    break;
  case T_PGSetToDefault:
    pcVar1 = "T_SetToDefault";
    break;
  case T_PGCurrentOfExpr:
    pcVar1 = "T_CurrentOfExpr";
    break;
  case T_PGNextValueExpr:
    pcVar1 = "T_NextValueExpr";
    break;
  case T_PGInferenceElem:
    pcVar1 = "T_InferenceElem";
    break;
  case T_PGTargetEntry:
    pcVar1 = "T_TargetEntry";
    break;
  case T_PGRangeTblRef:
    pcVar1 = "T_RangeTblRef";
    break;
  case T_PGJoinExpr:
    pcVar1 = "T_JoinExpr";
    break;
  case T_PGFromExpr:
    pcVar1 = "T_FromExpr";
    break;
  case T_PGOnConflictExpr:
    pcVar1 = "T_OnConflictExpr";
    break;
  case T_PGIntoClause:
    pcVar1 = "T_IntoClause";
    break;
  default:
    pcVar1 = "(UNKNOWN)";
    break;
  case T_PGExprState:
    pcVar1 = "T_ExprState";
    break;
  case T_PGAggrefExprState:
    pcVar1 = "T_AggrefExprState";
    break;
  case T_PGWindowFuncExprState:
    pcVar1 = "T_WindowFuncExprState";
    break;
  case T_PGSetExprState:
    pcVar1 = "T_SetExprState";
    break;
  case T_PGSubPlanState:
    pcVar1 = "T_SubPlanState";
    break;
  case T_PGAlternativeSubPlanState:
    pcVar1 = "T_AlternativeSubPlanState";
    break;
  case T_PGDomainConstraintState:
    pcVar1 = "T_DomainConstraintState";
    break;
  case T_PGPlannerInfo:
    pcVar1 = "T_PlannerInfo";
    break;
  case T_PGPlannerGlobal:
    pcVar1 = "T_PlannerGlobal";
    break;
  case T_PGRelOptInfo:
    pcVar1 = "T_RelOptInfo";
    break;
  case T_PGIndexOptInfo:
    pcVar1 = "T_IndexOptInfo";
    break;
  case T_PGForeignKeyOptInfo:
    pcVar1 = "T_ForeignKeyOptInfo";
    break;
  case T_PGParamPathInfo:
    pcVar1 = "T_ParamPathInfo";
    break;
  case T_PGPath:
    pcVar1 = "T_Path";
    break;
  case T_PGIndexPath:
    pcVar1 = "T_IndexPath";
    break;
  case T_PGBitmapHeapPath:
    pcVar1 = "T_BitmapHeapPath";
    break;
  case T_PGBitmapAndPath:
    pcVar1 = "T_BitmapAndPath";
    break;
  case T_PGBitmapOrPath:
    pcVar1 = "T_BitmapOrPath";
    break;
  case T_PGTidPath:
    pcVar1 = "T_TidPath";
    break;
  case T_PGSubqueryScanPath:
    pcVar1 = "T_SubqueryScanPath";
    break;
  case T_PGForeignPath:
    pcVar1 = "T_ForeignPath";
    break;
  case T_PGCustomPath:
    pcVar1 = "T_CustomPath";
    break;
  case T_PGNestPath:
    pcVar1 = "T_NestPath";
    break;
  case T_PGMergePath:
    pcVar1 = "T_MergePath";
    break;
  case T_PGHashPath:
    pcVar1 = "T_HashPath";
    break;
  case T_PGAppendPath:
    pcVar1 = "T_AppendPath";
    break;
  case T_PGMergeAppendPath:
    pcVar1 = "T_MergeAppendPath";
    break;
  case T_PGResultPath:
    pcVar1 = "T_ResultPath";
    break;
  case T_PGMaterialPath:
    pcVar1 = "T_MaterialPath";
    break;
  case T_PGUniquePath:
    pcVar1 = "T_UniquePath";
    break;
  case T_PGGatherPath:
    pcVar1 = "T_GatherPath";
    break;
  case T_PGGatherMergePath:
    pcVar1 = "T_GatherMergePath";
    break;
  case T_PGProjectionPath:
    pcVar1 = "T_ProjectionPath";
    break;
  case T_PGProjectSetPath:
    pcVar1 = "T_ProjectSetPath";
    break;
  case T_PGSortPath:
    pcVar1 = "T_SortPath";
    break;
  case T_PGGroupPath:
    pcVar1 = "T_GroupPath";
    break;
  case T_PGUpperUniquePath:
    pcVar1 = "T_UpperUniquePath";
    break;
  case T_PGAggPath:
    pcVar1 = "T_AggPath";
    break;
  case T_PGGroupingSetsPath:
    pcVar1 = "T_GroupingSetsPath";
    break;
  case T_PGMinMaxAggPath:
    pcVar1 = "T_MinMaxAggPath";
    break;
  case T_PGWindowAggPath:
    pcVar1 = "T_WindowAggPath";
    break;
  case T_PGSetOpPath:
    pcVar1 = "T_SetOpPath";
    break;
  case T_PGRecursiveUnionPath:
    pcVar1 = "T_RecursiveUnionPath";
    break;
  case T_PGLockRowsPath:
    pcVar1 = "T_LockRowsPath";
    break;
  case T_PGModifyTablePath:
    pcVar1 = "T_ModifyTablePath";
    break;
  case T_PGLimitPath:
    pcVar1 = "T_LimitPath";
    break;
  case T_PGEquivalenceClass:
    pcVar1 = "T_EquivalenceClass";
    break;
  case T_PGEquivalenceMember:
    pcVar1 = "T_EquivalenceMember";
    break;
  case T_PGPathKey:
    pcVar1 = "T_PathKey";
    break;
  case T_PGPathTarget:
    pcVar1 = "T_PathTarget";
    break;
  case T_PGRestrictInfo:
    pcVar1 = "T_RestrictInfo";
    break;
  case T_PGPlaceHolderVar:
    pcVar1 = "T_PlaceHolderVar";
    break;
  case T_PGSpecialJoinInfo:
    pcVar1 = "T_SpecialJoinInfo";
    break;
  case T_PGAppendRelInfo:
    pcVar1 = "T_AppendRelInfo";
    break;
  case T_PGPartitionedChildRelInfo:
    pcVar1 = "T_PartitionedChildRelInfo";
    break;
  case T_PGPlaceHolderInfo:
    pcVar1 = "T_PlaceHolderInfo";
    break;
  case T_PGMinMaxAggInfo:
    pcVar1 = "T_MinMaxAggInfo";
    break;
  case T_PGPlannerParamItem:
    pcVar1 = "T_PlannerParamItem";
    break;
  case T_PGRollupData:
    pcVar1 = "T_RollupData";
    break;
  case T_PGGroupingSetData:
    pcVar1 = "T_GroupingSetData";
    break;
  case T_PGStatisticExtInfo:
    pcVar1 = "T_StatisticExtInfo";
    break;
  case T_PGMemoryContext:
    pcVar1 = "T_MemoryContext";
    break;
  case T_PGAllocSetContext:
    pcVar1 = "T_AllocSetContext";
    break;
  case T_PGSlabContext:
    pcVar1 = "T_SlabContext";
    break;
  case T_PGValue:
    pcVar1 = "T_Value";
    break;
  case T_PGInteger:
    pcVar1 = "T_Integer";
    break;
  case T_PGFloat:
    pcVar1 = "T_Float";
    break;
  case T_PGString:
    pcVar1 = "T_String";
    break;
  case T_PGBitString:
    pcVar1 = "T_BitString";
    break;
  case T_PGNull:
    pcVar1 = "T_Null";
    break;
  case T_PGList:
    pcVar1 = "T_List";
    break;
  case T_PGIntList:
    pcVar1 = "T_IntList";
    break;
  case T_PGOidList:
    pcVar1 = "T_OidList";
    break;
  case T_PGExtensibleNode:
    pcVar1 = "T_ExtensibleNode";
    break;
  case T_PGRawStmt:
    pcVar1 = "T_RawStmt";
    break;
  case T_PGQuery:
    pcVar1 = "T_Query";
    break;
  case T_PGPlannedStmt:
    pcVar1 = "T_PlannedStmt";
    break;
  case T_PGInsertStmt:
    pcVar1 = "T_InsertStmt";
    break;
  case T_PGDeleteStmt:
    pcVar1 = "T_DeleteStmt";
    break;
  case T_PGUpdateStmt:
    pcVar1 = "T_UpdateStmt";
    break;
  case T_PGUpdateExtensionsStmt:
    pcVar1 = "T_UpdateExtensionsStmt";
    break;
  case T_PGSelectStmt:
    pcVar1 = "T_SelectStmt";
    break;
  case T_PGAlterTableStmt:
    pcVar1 = "T_AlterTableStmt";
    break;
  case T_PGAlterTableCmd:
    pcVar1 = "T_AlterTableCmd";
    break;
  case T_PGAlterDomainStmt:
    pcVar1 = "T_AlterDomainStmt";
    break;
  case T_PGSetOperationStmt:
    pcVar1 = "T_SetOperationStmt";
    break;
  case T_PGGrantStmt:
    pcVar1 = "T_GrantStmt";
    break;
  case T_PGGrantRoleStmt:
    pcVar1 = "T_GrantRoleStmt";
    break;
  case T_PGAlterDefaultPrivilegesStmt:
    pcVar1 = "T_AlterDefaultPrivilegesStmt";
    break;
  case T_PGClosePortalStmt:
    pcVar1 = "T_ClosePortalStmt";
    break;
  case T_PGClusterStmt:
    pcVar1 = "T_ClusterStmt";
    break;
  case T_PGCopyStmt:
    pcVar1 = "T_CopyStmt";
    break;
  case T_PGCreateStmt:
    pcVar1 = "T_CreateStmt";
    break;
  case T_PGDefineStmt:
    pcVar1 = "T_DefineStmt";
    break;
  case T_PGDropStmt:
    pcVar1 = "T_DropStmt";
    break;
  case T_PGTruncateStmt:
    pcVar1 = "T_TruncateStmt";
    break;
  case T_PGCommentStmt:
    pcVar1 = "T_CommentStmt";
    break;
  case T_PGCommentOnStmt:
    pcVar1 = "T_CommentOnStmt";
    break;
  case T_PGFetchStmt:
    pcVar1 = "T_FetchStmt";
    break;
  case T_PGIndexStmt:
    pcVar1 = "T_IndexStmt";
    break;
  case T_PGCreateFunctionStmt:
    pcVar1 = "T_CreateFunctionStmt";
    break;
  case T_PGAlterFunctionStmt:
    pcVar1 = "T_AlterFunctionStmt";
    break;
  case T_PGDoStmt:
    pcVar1 = "T_DoStmt";
    break;
  case T_PGRenameStmt:
    pcVar1 = "T_RenameStmt";
    break;
  case T_PGRuleStmt:
    pcVar1 = "T_RuleStmt";
    break;
  case T_PGNotifyStmt:
    pcVar1 = "T_NotifyStmt";
    break;
  case T_PGListenStmt:
    pcVar1 = "T_ListenStmt";
    break;
  case T_PGUnlistenStmt:
    pcVar1 = "T_UnlistenStmt";
    break;
  case T_PGTransactionStmt:
    pcVar1 = "T_TransactionStmt";
    break;
  case T_PGViewStmt:
    pcVar1 = "T_ViewStmt";
    break;
  case T_PGLoadStmt:
    pcVar1 = "T_LoadStmt";
    break;
  case T_PGCreateDomainStmt:
    pcVar1 = "T_CreateDomainStmt";
    break;
  case T_PGCreatedbStmt:
    pcVar1 = "T_CreatedbStmt";
    break;
  case T_PGDropdbStmt:
    pcVar1 = "T_DropdbStmt";
    break;
  case T_PGVacuumStmt:
    pcVar1 = "T_VacuumStmt";
    break;
  case T_PGExplainStmt:
    pcVar1 = "T_ExplainStmt";
    break;
  case T_PGCreateTableAsStmt:
    pcVar1 = "T_CreateTableAsStmt";
    break;
  case T_PGCreateSeqStmt:
    pcVar1 = "T_CreateSeqStmt";
    break;
  case T_PGAlterSeqStmt:
    pcVar1 = "T_AlterSeqStmt";
    break;
  case T_PGVariableSetStmt:
    pcVar1 = "T_VariableSetStmt";
    break;
  case T_PGVariableShowStmt:
    pcVar1 = "T_VariableShowStmt";
    break;
  case T_PGVariableShowSelectStmt:
    pcVar1 = "T_VariableShowSelectStmt";
    break;
  case T_PGDiscardStmt:
    pcVar1 = "T_DiscardStmt";
    break;
  case T_PGCreateTrigStmt:
    pcVar1 = "T_CreateTrigStmt";
    break;
  case T_PGCreatePLangStmt:
    pcVar1 = "T_CreatePLangStmt";
    break;
  case T_PGCreateRoleStmt:
    pcVar1 = "T_CreateRoleStmt";
    break;
  case T_PGAlterRoleStmt:
    pcVar1 = "T_AlterRoleStmt";
    break;
  case T_PGDropRoleStmt:
    pcVar1 = "T_DropRoleStmt";
    break;
  case T_PGLockStmt:
    pcVar1 = "T_LockStmt";
    break;
  case T_PGConstraintsSetStmt:
    pcVar1 = "T_ConstraintsSetStmt";
    break;
  case T_PGReindexStmt:
    pcVar1 = "T_ReindexStmt";
    break;
  case T_PGCheckPointStmt:
    pcVar1 = "T_CheckPointStmt";
    break;
  case T_PGCreateSchemaStmt:
    pcVar1 = "T_CreateSchemaStmt";
    break;
  case T_PGAlterDatabaseStmt:
    pcVar1 = "T_AlterDatabaseStmt";
    break;
  case T_PGAlterDatabaseSetStmt:
    pcVar1 = "T_AlterDatabaseSetStmt";
    break;
  case T_PGAlterRoleSetStmt:
    pcVar1 = "T_AlterRoleSetStmt";
    break;
  case T_PGCreateConversionStmt:
    pcVar1 = "T_CreateConversionStmt";
    break;
  case T_PGCreateCastStmt:
    pcVar1 = "T_CreateCastStmt";
    break;
  case T_PGCreateOpClassStmt:
    pcVar1 = "T_CreateOpClassStmt";
    break;
  case T_PGCreateOpFamilyStmt:
    pcVar1 = "T_CreateOpFamilyStmt";
    break;
  case T_PGAlterOpFamilyStmt:
    pcVar1 = "T_AlterOpFamilyStmt";
    break;
  case T_PGPrepareStmt:
    pcVar1 = "T_PrepareStmt";
    break;
  case T_PGExecuteStmt:
    pcVar1 = "T_ExecuteStmt";
    break;
  case T_PGCallStmt:
    pcVar1 = "T_CallStmt";
    break;
  case T_PGDeallocateStmt:
    pcVar1 = "T_DeallocateStmt";
    break;
  case T_PGDeclareCursorStmt:
    pcVar1 = "T_DeclareCursorStmt";
    break;
  case T_PGCreateTableSpaceStmt:
    pcVar1 = "T_CreateTableSpaceStmt";
    break;
  case T_PGDropTableSpaceStmt:
    pcVar1 = "T_DropTableSpaceStmt";
    break;
  case T_PGAlterObjectDependsStmt:
    pcVar1 = "T_AlterObjectDependsStmt";
    break;
  case T_PGAlterObjectSchemaStmt:
    pcVar1 = "T_AlterObjectSchemaStmt";
    break;
  case T_PGAlterOwnerStmt:
    pcVar1 = "T_AlterOwnerStmt";
    break;
  case T_PGAlterOperatorStmt:
    pcVar1 = "T_AlterOperatorStmt";
    break;
  case T_PGDropOwnedStmt:
    pcVar1 = "T_DropOwnedStmt";
    break;
  case T_PGReassignOwnedStmt:
    pcVar1 = "T_ReassignOwnedStmt";
    break;
  case T_PGCompositeTypeStmt:
    pcVar1 = "T_CompositeTypeStmt";
    break;
  case T_PGCreateTypeStmt:
    pcVar1 = "T_CreateTypeStmt";
    break;
  case T_PGCreateRangeStmt:
    pcVar1 = "T_CreateRangeStmt";
    break;
  case T_PGAlterEnumStmt:
    pcVar1 = "T_AlterEnumStmt";
    break;
  case T_PGAlterTSDictionaryStmt:
    pcVar1 = "T_AlterTSDictionaryStmt";
    break;
  case T_PGAlterTSConfigurationStmt:
    pcVar1 = "T_AlterTSConfigurationStmt";
    break;
  case T_PGCreateFdwStmt:
    pcVar1 = "T_CreateFdwStmt";
    break;
  case T_PGAlterFdwStmt:
    pcVar1 = "T_AlterFdwStmt";
    break;
  case T_PGCreateForeignServerStmt:
    pcVar1 = "T_CreateForeignServerStmt";
    break;
  case T_PGAlterForeignServerStmt:
    pcVar1 = "T_AlterForeignServerStmt";
    break;
  case T_PGCreateUserMappingStmt:
    pcVar1 = "T_CreateUserMappingStmt";
    break;
  case T_PGAlterUserMappingStmt:
    pcVar1 = "T_AlterUserMappingStmt";
    break;
  case T_PGDropUserMappingStmt:
    pcVar1 = "T_DropUserMappingStmt";
    break;
  case T_PGAlterTableSpaceOptionsStmt:
    pcVar1 = "T_AlterTableSpaceOptionsStmt";
    break;
  case T_PGAlterTableMoveAllStmt:
    pcVar1 = "T_AlterTableMoveAllStmt";
    break;
  case T_PGSecLabelStmt:
    pcVar1 = "T_SecLabelStmt";
    break;
  case T_PGCreateForeignTableStmt:
    pcVar1 = "T_CreateForeignTableStmt";
    break;
  case T_PGImportForeignSchemaStmt:
    pcVar1 = "T_ImportForeignSchemaStmt";
    break;
  case T_PGCreateExtensionStmt:
    pcVar1 = "T_CreateExtensionStmt";
    break;
  case T_PGAlterExtensionStmt:
    pcVar1 = "T_AlterExtensionStmt";
    break;
  case T_PGAlterExtensionContentsStmt:
    pcVar1 = "T_AlterExtensionContentsStmt";
    break;
  case T_PGCreateEventTrigStmt:
    pcVar1 = "T_CreateEventTrigStmt";
    break;
  case T_PGAlterEventTrigStmt:
    pcVar1 = "T_AlterEventTrigStmt";
    break;
  case T_PGRefreshMatViewStmt:
    pcVar1 = "T_RefreshMatViewStmt";
    break;
  case T_PGReplicaIdentityStmt:
    pcVar1 = "T_ReplicaIdentityStmt";
    break;
  case T_PGAlterSystemStmt:
    pcVar1 = "T_AlterSystemStmt";
    break;
  case T_PGCreatePolicyStmt:
    pcVar1 = "T_CreatePolicyStmt";
    break;
  case T_PGAlterPolicyStmt:
    pcVar1 = "T_AlterPolicyStmt";
    break;
  case T_PGCreateTransformStmt:
    pcVar1 = "T_CreateTransformStmt";
    break;
  case T_PGCreateAmStmt:
    pcVar1 = "T_CreateAmStmt";
    break;
  case T_PGCreatePublicationStmt:
    pcVar1 = "T_CreatePublicationStmt";
    break;
  case T_PGAlterPublicationStmt:
    pcVar1 = "T_AlterPublicationStmt";
    break;
  case T_PGCreateSubscriptionStmt:
    pcVar1 = "T_CreateSubscriptionStmt";
    break;
  case T_PGAlterSubscriptionStmt:
    pcVar1 = "T_AlterSubscriptionStmt";
    break;
  case T_PGDropSubscriptionStmt:
    pcVar1 = "T_DropSubscriptionStmt";
    break;
  case T_PGCreateStatsStmt:
    pcVar1 = "T_CreateStatsStmt";
    break;
  case T_PGAlterCollationStmt:
    pcVar1 = "T_AlterCollationStmt";
    break;
  case T_PGAttachStmt:
    pcVar1 = "T_PGAttachStmt";
    break;
  case T_PGUseStmt:
    pcVar1 = "T_PGUseStmt";
    break;
  case T_PGAExpr:
    pcVar1 = "TAExpr";
    break;
  case T_PGColumnRef:
    pcVar1 = "T_ColumnRef";
    break;
  case T_PGParamRef:
    pcVar1 = "T_ParamRef";
    break;
  case T_PGAConst:
    pcVar1 = "TAConst";
    break;
  case T_PGFuncCall:
    pcVar1 = "T_FuncCall";
    break;
  case T_PGAStar:
    pcVar1 = "TAStar";
    break;
  case T_PGAIndices:
    pcVar1 = "TAIndices";
    break;
  case T_PGAIndirection:
    pcVar1 = "TAIndirection";
    break;
  case T_PGAArrayExpr:
    pcVar1 = "TAArrayExpr";
    break;
  case T_PGResTarget:
    pcVar1 = "T_ResTarget";
    break;
  case T_PGMultiAssignRef:
    pcVar1 = "T_MultiAssignRef";
    break;
  case T_PGTypeCast:
    pcVar1 = "T_TypeCast";
    break;
  case T_PGCollateClause:
    pcVar1 = "T_CollateClause";
    break;
  case T_PGSortBy:
    pcVar1 = "T_SortBy";
    break;
  case T_PGWindowDef:
    pcVar1 = "T_WindowDef";
    break;
  case T_PGRangeSubselect:
    pcVar1 = "T_RangeSubselect";
    break;
  case T_PGRangeFunction:
    pcVar1 = "T_RangeFunction";
    break;
  case T_PGRangeTableSample:
    pcVar1 = "T_RangeTableSample";
    break;
  case T_PGRangeTableFunc:
    pcVar1 = "T_RangeTableFunc";
    break;
  case T_PGRangeTableFuncCol:
    pcVar1 = "T_RangeTableFuncCol";
    break;
  case T_PGTypeName:
    pcVar1 = "T_TypeName";
    break;
  case T_PGColumnDef:
    pcVar1 = "T_ColumnDef";
    break;
  case T_PGIndexElem:
    pcVar1 = "T_IndexElem";
    break;
  case T_PGConstraint:
    pcVar1 = "T_Constraint";
    break;
  case T_PGDefElem:
    pcVar1 = "T_DefElem";
    break;
  case T_PGRangeTblEntry:
    pcVar1 = "T_RangeTblEntry";
    break;
  case T_PGRangeTblFunction:
    pcVar1 = "T_RangeTblFunction";
    break;
  case T_PGTableSampleClause:
    pcVar1 = "T_TableSampleClause";
    break;
  case T_PGWithCheckOption:
    pcVar1 = "T_WithCheckOption";
    break;
  case T_PGSortGroupClause:
    pcVar1 = "T_SortGroupClause";
    break;
  case T_PGGroupingSet:
    pcVar1 = "T_GroupingSet";
    break;
  case T_PGWindowClause:
    pcVar1 = "T_WindowClause";
    break;
  case T_PGObjectWithArgs:
    pcVar1 = "T_ObjectWithArgs";
    break;
  case T_PGAccessPriv:
    pcVar1 = "T_AccessPriv";
    break;
  case T_PGCreateOpClassItem:
    pcVar1 = "T_CreateOpClassItem";
    break;
  case T_PGTableLikeClause:
    pcVar1 = "T_TableLikeClause";
    break;
  case T_PGFunctionParameter:
    pcVar1 = "T_FunctionParameter";
    break;
  case T_PGLockingClause:
    pcVar1 = "T_LockingClause";
    break;
  case T_PGRowMarkClause:
    pcVar1 = "T_RowMarkClause";
    break;
  case T_PGXmlSerialize:
    pcVar1 = "T_XmlSerialize";
    break;
  case T_PGWithClause:
    pcVar1 = "T_WithClause";
    break;
  case T_PGInferClause:
    pcVar1 = "T_InferClause";
    break;
  case T_PGOnConflictClause:
    pcVar1 = "T_OnConflictClause";
    break;
  case T_PGCommonTableExpr:
    pcVar1 = "T_CommonTableExpr";
    break;
  case T_PGRoleSpec:
    pcVar1 = "T_RoleSpec";
    break;
  case T_PGTriggerTransition:
    pcVar1 = "T_TriggerTransition";
    break;
  case T_PGPartitionElem:
    pcVar1 = "T_PartitionElem";
    break;
  case T_PGPartitionSpec:
    pcVar1 = "T_PartitionSpec";
    break;
  case T_PGPartitionBoundSpec:
    pcVar1 = "T_PartitionBoundSpec";
    break;
  case T_PGPartitionRangeDatum:
    pcVar1 = "T_PartitionRangeDatum";
    break;
  case T_PGPartitionCmd:
    pcVar1 = "T_PartitionCmd";
    break;
  case T_PGIdentifySystemCmd:
    pcVar1 = "T_IdentifySystemCmd";
    break;
  case T_PGBaseBackupCmd:
    pcVar1 = "T_BaseBackupCmd";
    break;
  case T_PGCreateReplicationSlotCmd:
    pcVar1 = "T_CreateReplicationSlotCmd";
    break;
  case T_PGDropReplicationSlotCmd:
    pcVar1 = "T_DropReplicationSlotCmd";
    break;
  case T_PGStartReplicationCmd:
    pcVar1 = "T_StartReplicationCmd";
    break;
  case T_PGTimeLineHistoryCmd:
    pcVar1 = "T_TimeLineHistoryCmd";
    break;
  case T_PGSQLCmd:
    pcVar1 = "T_SQLCmd";
    break;
  case T_PGTriggerData:
    pcVar1 = "T_TriggerData";
    break;
  case T_PGEventTriggerData:
    pcVar1 = "T_EventTriggerData";
    break;
  case T_PGReturnSetInfo:
    pcVar1 = "T_ReturnSetInfo";
    break;
  case T_PGWindowObjectData:
    pcVar1 = "T_WindowObjectData";
    break;
  case T_PGTIDBitmap:
    pcVar1 = "T_TIDBitmap";
    break;
  case T_PGInlineCodeBlock:
    pcVar1 = "T_InlineCodeBlock";
    break;
  case T_PGFdwRoutine:
    pcVar1 = "T_FdwRoutine";
    break;
  case T_PGIndexAmRoutine:
    pcVar1 = "T_IndexAmRoutine";
    break;
  case T_PGTsmRoutine:
    pcVar1 = "T_TsmRoutine";
    break;
  case T_PGForeignKeyCacheInfo:
    pcVar1 = "T_ForeignKeyCacheInfo";
  }
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,&local_9);
  return __return_storage_ptr__;
}

Assistant:

std::string Transformer::NodetypeToString(duckdb_libpgquery::PGNodeTag type) { // LCOV_EXCL_START
	switch (type) {
	case duckdb_libpgquery::T_PGInvalid:
		return "T_Invalid";
	case duckdb_libpgquery::T_PGIndexInfo:
		return "T_IndexInfo";
	case duckdb_libpgquery::T_PGExprContext:
		return "T_ExprContext";
	case duckdb_libpgquery::T_PGProjectionInfo:
		return "T_ProjectionInfo";
	case duckdb_libpgquery::T_PGJunkFilter:
		return "T_JunkFilter";
	case duckdb_libpgquery::T_PGResultRelInfo:
		return "T_ResultRelInfo";
	case duckdb_libpgquery::T_PGEState:
		return "T_EState";
	case duckdb_libpgquery::T_PGTupleTableSlot:
		return "T_TupleTableSlot";
	case duckdb_libpgquery::T_PGPlan:
		return "T_Plan";
	case duckdb_libpgquery::T_PGResult:
		return "T_Result";
	case duckdb_libpgquery::T_PGProjectSet:
		return "T_ProjectSet";
	case duckdb_libpgquery::T_PGModifyTable:
		return "T_ModifyTable";
	case duckdb_libpgquery::T_PGAppend:
		return "T_Append";
	case duckdb_libpgquery::T_PGMergeAppend:
		return "T_MergeAppend";
	case duckdb_libpgquery::T_PGRecursiveUnion:
		return "T_RecursiveUnion";
	case duckdb_libpgquery::T_PGBitmapAnd:
		return "T_BitmapAnd";
	case duckdb_libpgquery::T_PGBitmapOr:
		return "T_BitmapOr";
	case duckdb_libpgquery::T_PGScan:
		return "T_Scan";
	case duckdb_libpgquery::T_PGSeqScan:
		return "T_SeqScan";
	case duckdb_libpgquery::T_PGSampleScan:
		return "T_SampleScan";
	case duckdb_libpgquery::T_PGIndexScan:
		return "T_IndexScan";
	case duckdb_libpgquery::T_PGIndexOnlyScan:
		return "T_IndexOnlyScan";
	case duckdb_libpgquery::T_PGBitmapIndexScan:
		return "T_BitmapIndexScan";
	case duckdb_libpgquery::T_PGBitmapHeapScan:
		return "T_BitmapHeapScan";
	case duckdb_libpgquery::T_PGTidScan:
		return "T_TidScan";
	case duckdb_libpgquery::T_PGSubqueryScan:
		return "T_SubqueryScan";
	case duckdb_libpgquery::T_PGFunctionScan:
		return "T_FunctionScan";
	case duckdb_libpgquery::T_PGValuesScan:
		return "T_ValuesScan";
	case duckdb_libpgquery::T_PGTableFuncScan:
		return "T_TableFuncScan";
	case duckdb_libpgquery::T_PGCteScan:
		return "T_CteScan";
	case duckdb_libpgquery::T_PGNamedTuplestoreScan:
		return "T_NamedTuplestoreScan";
	case duckdb_libpgquery::T_PGWorkTableScan:
		return "T_WorkTableScan";
	case duckdb_libpgquery::T_PGForeignScan:
		return "T_ForeignScan";
	case duckdb_libpgquery::T_PGCustomScan:
		return "T_CustomScan";
	case duckdb_libpgquery::T_PGJoin:
		return "T_Join";
	case duckdb_libpgquery::T_PGNestLoop:
		return "T_NestLoop";
	case duckdb_libpgquery::T_PGMergeJoin:
		return "T_MergeJoin";
	case duckdb_libpgquery::T_PGHashJoin:
		return "T_HashJoin";
	case duckdb_libpgquery::T_PGMaterial:
		return "T_Material";
	case duckdb_libpgquery::T_PGSort:
		return "T_Sort";
	case duckdb_libpgquery::T_PGGroup:
		return "T_Group";
	case duckdb_libpgquery::T_PGAgg:
		return "T_Agg";
	case duckdb_libpgquery::T_PGWindowAgg:
		return "T_WindowAgg";
	case duckdb_libpgquery::T_PGUnique:
		return "T_Unique";
	case duckdb_libpgquery::T_PGGather:
		return "T_Gather";
	case duckdb_libpgquery::T_PGGatherMerge:
		return "T_GatherMerge";
	case duckdb_libpgquery::T_PGHash:
		return "T_Hash";
	case duckdb_libpgquery::T_PGSetOp:
		return "T_SetOp";
	case duckdb_libpgquery::T_PGLockRows:
		return "T_LockRows";
	case duckdb_libpgquery::T_PGLimit:
		return "T_Limit";
	case duckdb_libpgquery::T_PGNestLoopParam:
		return "T_NestLoopParam";
	case duckdb_libpgquery::T_PGPlanRowMark:
		return "T_PlanRowMark";
	case duckdb_libpgquery::T_PGPlanInvalItem:
		return "T_PlanInvalItem";
	case duckdb_libpgquery::T_PGPlanState:
		return "T_PlanState";
	case duckdb_libpgquery::T_PGResultState:
		return "T_ResultState";
	case duckdb_libpgquery::T_PGProjectSetState:
		return "T_ProjectSetState";
	case duckdb_libpgquery::T_PGModifyTableState:
		return "T_ModifyTableState";
	case duckdb_libpgquery::T_PGAppendState:
		return "T_AppendState";
	case duckdb_libpgquery::T_PGMergeAppendState:
		return "T_MergeAppendState";
	case duckdb_libpgquery::T_PGRecursiveUnionState:
		return "T_RecursiveUnionState";
	case duckdb_libpgquery::T_PGBitmapAndState:
		return "T_BitmapAndState";
	case duckdb_libpgquery::T_PGBitmapOrState:
		return "T_BitmapOrState";
	case duckdb_libpgquery::T_PGScanState:
		return "T_ScanState";
	case duckdb_libpgquery::T_PGSeqScanState:
		return "T_SeqScanState";
	case duckdb_libpgquery::T_PGSampleScanState:
		return "T_SampleScanState";
	case duckdb_libpgquery::T_PGIndexScanState:
		return "T_IndexScanState";
	case duckdb_libpgquery::T_PGIndexOnlyScanState:
		return "T_IndexOnlyScanState";
	case duckdb_libpgquery::T_PGBitmapIndexScanState:
		return "T_BitmapIndexScanState";
	case duckdb_libpgquery::T_PGBitmapHeapScanState:
		return "T_BitmapHeapScanState";
	case duckdb_libpgquery::T_PGTidScanState:
		return "T_TidScanState";
	case duckdb_libpgquery::T_PGSubqueryScanState:
		return "T_SubqueryScanState";
	case duckdb_libpgquery::T_PGFunctionScanState:
		return "T_FunctionScanState";
	case duckdb_libpgquery::T_PGTableFuncScanState:
		return "T_TableFuncScanState";
	case duckdb_libpgquery::T_PGValuesScanState:
		return "T_ValuesScanState";
	case duckdb_libpgquery::T_PGCteScanState:
		return "T_CteScanState";
	case duckdb_libpgquery::T_PGNamedTuplestoreScanState:
		return "T_NamedTuplestoreScanState";
	case duckdb_libpgquery::T_PGWorkTableScanState:
		return "T_WorkTableScanState";
	case duckdb_libpgquery::T_PGForeignScanState:
		return "T_ForeignScanState";
	case duckdb_libpgquery::T_PGCustomScanState:
		return "T_CustomScanState";
	case duckdb_libpgquery::T_PGJoinState:
		return "T_JoinState";
	case duckdb_libpgquery::T_PGNestLoopState:
		return "T_NestLoopState";
	case duckdb_libpgquery::T_PGMergeJoinState:
		return "T_MergeJoinState";
	case duckdb_libpgquery::T_PGHashJoinState:
		return "T_HashJoinState";
	case duckdb_libpgquery::T_PGMaterialState:
		return "T_MaterialState";
	case duckdb_libpgquery::T_PGSortState:
		return "T_SortState";
	case duckdb_libpgquery::T_PGGroupState:
		return "T_GroupState";
	case duckdb_libpgquery::T_PGAggState:
		return "T_AggState";
	case duckdb_libpgquery::T_PGWindowAggState:
		return "T_WindowAggState";
	case duckdb_libpgquery::T_PGUniqueState:
		return "T_UniqueState";
	case duckdb_libpgquery::T_PGGatherState:
		return "T_GatherState";
	case duckdb_libpgquery::T_PGGatherMergeState:
		return "T_GatherMergeState";
	case duckdb_libpgquery::T_PGHashState:
		return "T_HashState";
	case duckdb_libpgquery::T_PGSetOpState:
		return "T_SetOpState";
	case duckdb_libpgquery::T_PGLockRowsState:
		return "T_LockRowsState";
	case duckdb_libpgquery::T_PGLimitState:
		return "T_LimitState";
	case duckdb_libpgquery::T_PGAlias:
		return "T_Alias";
	case duckdb_libpgquery::T_PGRangeVar:
		return "T_RangeVar";
	case duckdb_libpgquery::T_PGTableFunc:
		return "T_TableFunc";
	case duckdb_libpgquery::T_PGExpr:
		return "T_Expr";
	case duckdb_libpgquery::T_PGVar:
		return "T_Var";
	case duckdb_libpgquery::T_PGConst:
		return "T_Const";
	case duckdb_libpgquery::T_PGParam:
		return "T_Param";
	case duckdb_libpgquery::T_PGAggref:
		return "T_Aggref";
	case duckdb_libpgquery::T_PGGroupingFunc:
		return "T_GroupingFunc";
	case duckdb_libpgquery::T_PGWindowFunc:
		return "T_WindowFunc";
	case duckdb_libpgquery::T_PGArrayRef:
		return "T_ArrayRef";
	case duckdb_libpgquery::T_PGFuncExpr:
		return "T_FuncExpr";
	case duckdb_libpgquery::T_PGNamedArgExpr:
		return "T_NamedArgExpr";
	case duckdb_libpgquery::T_PGOpExpr:
		return "T_OpExpr";
	case duckdb_libpgquery::T_PGDistinctExpr:
		return "T_DistinctExpr";
	case duckdb_libpgquery::T_PGNullIfExpr:
		return "T_NullIfExpr";
	case duckdb_libpgquery::T_PGScalarArrayOpExpr:
		return "T_ScalarArrayOpExpr";
	case duckdb_libpgquery::T_PGBoolExpr:
		return "T_BoolExpr";
	case duckdb_libpgquery::T_PGSubLink:
		return "T_SubLink";
	case duckdb_libpgquery::T_PGSubPlan:
		return "T_SubPlan";
	case duckdb_libpgquery::T_PGAlternativeSubPlan:
		return "T_AlternativeSubPlan";
	case duckdb_libpgquery::T_PGFieldSelect:
		return "T_FieldSelect";
	case duckdb_libpgquery::T_PGFieldStore:
		return "T_FieldStore";
	case duckdb_libpgquery::T_PGRelabelType:
		return "T_RelabelType";
	case duckdb_libpgquery::T_PGCoerceViaIO:
		return "T_CoerceViaIO";
	case duckdb_libpgquery::T_PGArrayCoerceExpr:
		return "T_ArrayCoerceExpr";
	case duckdb_libpgquery::T_PGConvertRowtypeExpr:
		return "T_ConvertRowtypeExpr";
	case duckdb_libpgquery::T_PGCollateExpr:
		return "T_CollateExpr";
	case duckdb_libpgquery::T_PGCaseExpr:
		return "T_CaseExpr";
	case duckdb_libpgquery::T_PGCaseWhen:
		return "T_CaseWhen";
	case duckdb_libpgquery::T_PGCaseTestExpr:
		return "T_CaseTestExpr";
	case duckdb_libpgquery::T_PGArrayExpr:
		return "T_ArrayExpr";
	case duckdb_libpgquery::T_PGRowExpr:
		return "T_RowExpr";
	case duckdb_libpgquery::T_PGRowCompareExpr:
		return "T_RowCompareExpr";
	case duckdb_libpgquery::T_PGCoalesceExpr:
		return "T_CoalesceExpr";
	case duckdb_libpgquery::T_PGMinMaxExpr:
		return "T_MinMaxExpr";
	case duckdb_libpgquery::T_PGSQLValueFunction:
		return "T_SQLValueFunction";
	case duckdb_libpgquery::T_PGXmlExpr:
		return "T_XmlExpr";
	case duckdb_libpgquery::T_PGNullTest:
		return "T_NullTest";
	case duckdb_libpgquery::T_PGBooleanTest:
		return "T_BooleanTest";
	case duckdb_libpgquery::T_PGCoerceToDomain:
		return "T_CoerceToDomain";
	case duckdb_libpgquery::T_PGCoerceToDomainValue:
		return "T_CoerceToDomainValue";
	case duckdb_libpgquery::T_PGSetToDefault:
		return "T_SetToDefault";
	case duckdb_libpgquery::T_PGCurrentOfExpr:
		return "T_CurrentOfExpr";
	case duckdb_libpgquery::T_PGNextValueExpr:
		return "T_NextValueExpr";
	case duckdb_libpgquery::T_PGInferenceElem:
		return "T_InferenceElem";
	case duckdb_libpgquery::T_PGTargetEntry:
		return "T_TargetEntry";
	case duckdb_libpgquery::T_PGRangeTblRef:
		return "T_RangeTblRef";
	case duckdb_libpgquery::T_PGJoinExpr:
		return "T_JoinExpr";
	case duckdb_libpgquery::T_PGFromExpr:
		return "T_FromExpr";
	case duckdb_libpgquery::T_PGOnConflictExpr:
		return "T_OnConflictExpr";
	case duckdb_libpgquery::T_PGIntoClause:
		return "T_IntoClause";
	case duckdb_libpgquery::T_PGExprState:
		return "T_ExprState";
	case duckdb_libpgquery::T_PGAggrefExprState:
		return "T_AggrefExprState";
	case duckdb_libpgquery::T_PGWindowFuncExprState:
		return "T_WindowFuncExprState";
	case duckdb_libpgquery::T_PGSetExprState:
		return "T_SetExprState";
	case duckdb_libpgquery::T_PGSubPlanState:
		return "T_SubPlanState";
	case duckdb_libpgquery::T_PGAlternativeSubPlanState:
		return "T_AlternativeSubPlanState";
	case duckdb_libpgquery::T_PGDomainConstraintState:
		return "T_DomainConstraintState";
	case duckdb_libpgquery::T_PGPlannerInfo:
		return "T_PlannerInfo";
	case duckdb_libpgquery::T_PGPlannerGlobal:
		return "T_PlannerGlobal";
	case duckdb_libpgquery::T_PGRelOptInfo:
		return "T_RelOptInfo";
	case duckdb_libpgquery::T_PGIndexOptInfo:
		return "T_IndexOptInfo";
	case duckdb_libpgquery::T_PGForeignKeyOptInfo:
		return "T_ForeignKeyOptInfo";
	case duckdb_libpgquery::T_PGParamPathInfo:
		return "T_ParamPathInfo";
	case duckdb_libpgquery::T_PGPath:
		return "T_Path";
	case duckdb_libpgquery::T_PGIndexPath:
		return "T_IndexPath";
	case duckdb_libpgquery::T_PGBitmapHeapPath:
		return "T_BitmapHeapPath";
	case duckdb_libpgquery::T_PGBitmapAndPath:
		return "T_BitmapAndPath";
	case duckdb_libpgquery::T_PGBitmapOrPath:
		return "T_BitmapOrPath";
	case duckdb_libpgquery::T_PGTidPath:
		return "T_TidPath";
	case duckdb_libpgquery::T_PGSubqueryScanPath:
		return "T_SubqueryScanPath";
	case duckdb_libpgquery::T_PGForeignPath:
		return "T_ForeignPath";
	case duckdb_libpgquery::T_PGCustomPath:
		return "T_CustomPath";
	case duckdb_libpgquery::T_PGNestPath:
		return "T_NestPath";
	case duckdb_libpgquery::T_PGMergePath:
		return "T_MergePath";
	case duckdb_libpgquery::T_PGHashPath:
		return "T_HashPath";
	case duckdb_libpgquery::T_PGAppendPath:
		return "T_AppendPath";
	case duckdb_libpgquery::T_PGMergeAppendPath:
		return "T_MergeAppendPath";
	case duckdb_libpgquery::T_PGResultPath:
		return "T_ResultPath";
	case duckdb_libpgquery::T_PGMaterialPath:
		return "T_MaterialPath";
	case duckdb_libpgquery::T_PGUniquePath:
		return "T_UniquePath";
	case duckdb_libpgquery::T_PGGatherPath:
		return "T_GatherPath";
	case duckdb_libpgquery::T_PGGatherMergePath:
		return "T_GatherMergePath";
	case duckdb_libpgquery::T_PGProjectionPath:
		return "T_ProjectionPath";
	case duckdb_libpgquery::T_PGProjectSetPath:
		return "T_ProjectSetPath";
	case duckdb_libpgquery::T_PGSortPath:
		return "T_SortPath";
	case duckdb_libpgquery::T_PGGroupPath:
		return "T_GroupPath";
	case duckdb_libpgquery::T_PGUpperUniquePath:
		return "T_UpperUniquePath";
	case duckdb_libpgquery::T_PGAggPath:
		return "T_AggPath";
	case duckdb_libpgquery::T_PGGroupingSetsPath:
		return "T_GroupingSetsPath";
	case duckdb_libpgquery::T_PGMinMaxAggPath:
		return "T_MinMaxAggPath";
	case duckdb_libpgquery::T_PGWindowAggPath:
		return "T_WindowAggPath";
	case duckdb_libpgquery::T_PGSetOpPath:
		return "T_SetOpPath";
	case duckdb_libpgquery::T_PGRecursiveUnionPath:
		return "T_RecursiveUnionPath";
	case duckdb_libpgquery::T_PGLockRowsPath:
		return "T_LockRowsPath";
	case duckdb_libpgquery::T_PGModifyTablePath:
		return "T_ModifyTablePath";
	case duckdb_libpgquery::T_PGLimitPath:
		return "T_LimitPath";
	case duckdb_libpgquery::T_PGEquivalenceClass:
		return "T_EquivalenceClass";
	case duckdb_libpgquery::T_PGEquivalenceMember:
		return "T_EquivalenceMember";
	case duckdb_libpgquery::T_PGPathKey:
		return "T_PathKey";
	case duckdb_libpgquery::T_PGPathTarget:
		return "T_PathTarget";
	case duckdb_libpgquery::T_PGRestrictInfo:
		return "T_RestrictInfo";
	case duckdb_libpgquery::T_PGPlaceHolderVar:
		return "T_PlaceHolderVar";
	case duckdb_libpgquery::T_PGSpecialJoinInfo:
		return "T_SpecialJoinInfo";
	case duckdb_libpgquery::T_PGAppendRelInfo:
		return "T_AppendRelInfo";
	case duckdb_libpgquery::T_PGPartitionedChildRelInfo:
		return "T_PartitionedChildRelInfo";
	case duckdb_libpgquery::T_PGPlaceHolderInfo:
		return "T_PlaceHolderInfo";
	case duckdb_libpgquery::T_PGMinMaxAggInfo:
		return "T_MinMaxAggInfo";
	case duckdb_libpgquery::T_PGPlannerParamItem:
		return "T_PlannerParamItem";
	case duckdb_libpgquery::T_PGRollupData:
		return "T_RollupData";
	case duckdb_libpgquery::T_PGGroupingSetData:
		return "T_GroupingSetData";
	case duckdb_libpgquery::T_PGStatisticExtInfo:
		return "T_StatisticExtInfo";
	case duckdb_libpgquery::T_PGMemoryContext:
		return "T_MemoryContext";
	case duckdb_libpgquery::T_PGAllocSetContext:
		return "T_AllocSetContext";
	case duckdb_libpgquery::T_PGSlabContext:
		return "T_SlabContext";
	case duckdb_libpgquery::T_PGValue:
		return "T_Value";
	case duckdb_libpgquery::T_PGInteger:
		return "T_Integer";
	case duckdb_libpgquery::T_PGFloat:
		return "T_Float";
	case duckdb_libpgquery::T_PGString:
		return "T_String";
	case duckdb_libpgquery::T_PGBitString:
		return "T_BitString";
	case duckdb_libpgquery::T_PGNull:
		return "T_Null";
	case duckdb_libpgquery::T_PGList:
		return "T_List";
	case duckdb_libpgquery::T_PGIntList:
		return "T_IntList";
	case duckdb_libpgquery::T_PGOidList:
		return "T_OidList";
	case duckdb_libpgquery::T_PGExtensibleNode:
		return "T_ExtensibleNode";
	case duckdb_libpgquery::T_PGRawStmt:
		return "T_RawStmt";
	case duckdb_libpgquery::T_PGQuery:
		return "T_Query";
	case duckdb_libpgquery::T_PGPlannedStmt:
		return "T_PlannedStmt";
	case duckdb_libpgquery::T_PGInsertStmt:
		return "T_InsertStmt";
	case duckdb_libpgquery::T_PGDeleteStmt:
		return "T_DeleteStmt";
	case duckdb_libpgquery::T_PGUpdateStmt:
		return "T_UpdateStmt";
	case duckdb_libpgquery::T_PGUpdateExtensionsStmt:
		return "T_UpdateExtensionsStmt";
	case duckdb_libpgquery::T_PGSelectStmt:
		return "T_SelectStmt";
	case duckdb_libpgquery::T_PGAlterTableStmt:
		return "T_AlterTableStmt";
	case duckdb_libpgquery::T_PGAlterTableCmd:
		return "T_AlterTableCmd";
	case duckdb_libpgquery::T_PGAlterDomainStmt:
		return "T_AlterDomainStmt";
	case duckdb_libpgquery::T_PGSetOperationStmt:
		return "T_SetOperationStmt";
	case duckdb_libpgquery::T_PGGrantStmt:
		return "T_GrantStmt";
	case duckdb_libpgquery::T_PGGrantRoleStmt:
		return "T_GrantRoleStmt";
	case duckdb_libpgquery::T_PGAlterDefaultPrivilegesStmt:
		return "T_AlterDefaultPrivilegesStmt";
	case duckdb_libpgquery::T_PGClosePortalStmt:
		return "T_ClosePortalStmt";
	case duckdb_libpgquery::T_PGClusterStmt:
		return "T_ClusterStmt";
	case duckdb_libpgquery::T_PGCommentOnStmt:
		return "T_CommentOnStmt";
	case duckdb_libpgquery::T_PGCopyStmt:
		return "T_CopyStmt";
	case duckdb_libpgquery::T_PGCreateStmt:
		return "T_CreateStmt";
	case duckdb_libpgquery::T_PGDefineStmt:
		return "T_DefineStmt";
	case duckdb_libpgquery::T_PGDropStmt:
		return "T_DropStmt";
	case duckdb_libpgquery::T_PGTruncateStmt:
		return "T_TruncateStmt";
	case duckdb_libpgquery::T_PGCommentStmt:
		return "T_CommentStmt";
	case duckdb_libpgquery::T_PGFetchStmt:
		return "T_FetchStmt";
	case duckdb_libpgquery::T_PGIndexStmt:
		return "T_IndexStmt";
	case duckdb_libpgquery::T_PGCreateFunctionStmt:
		return "T_CreateFunctionStmt";
	case duckdb_libpgquery::T_PGAlterFunctionStmt:
		return "T_AlterFunctionStmt";
	case duckdb_libpgquery::T_PGDoStmt:
		return "T_DoStmt";
	case duckdb_libpgquery::T_PGRenameStmt:
		return "T_RenameStmt";
	case duckdb_libpgquery::T_PGRuleStmt:
		return "T_RuleStmt";
	case duckdb_libpgquery::T_PGNotifyStmt:
		return "T_NotifyStmt";
	case duckdb_libpgquery::T_PGListenStmt:
		return "T_ListenStmt";
	case duckdb_libpgquery::T_PGUnlistenStmt:
		return "T_UnlistenStmt";
	case duckdb_libpgquery::T_PGTransactionStmt:
		return "T_TransactionStmt";
	case duckdb_libpgquery::T_PGViewStmt:
		return "T_ViewStmt";
	case duckdb_libpgquery::T_PGLoadStmt:
		return "T_LoadStmt";
	case duckdb_libpgquery::T_PGCreateDomainStmt:
		return "T_CreateDomainStmt";
	case duckdb_libpgquery::T_PGCreatedbStmt:
		return "T_CreatedbStmt";
	case duckdb_libpgquery::T_PGDropdbStmt:
		return "T_DropdbStmt";
	case duckdb_libpgquery::T_PGVacuumStmt:
		return "T_VacuumStmt";
	case duckdb_libpgquery::T_PGExplainStmt:
		return "T_ExplainStmt";
	case duckdb_libpgquery::T_PGCreateTableAsStmt:
		return "T_CreateTableAsStmt";
	case duckdb_libpgquery::T_PGCreateSeqStmt:
		return "T_CreateSeqStmt";
	case duckdb_libpgquery::T_PGAlterSeqStmt:
		return "T_AlterSeqStmt";
	case duckdb_libpgquery::T_PGVariableSetStmt:
		return "T_VariableSetStmt";
	case duckdb_libpgquery::T_PGVariableShowStmt:
		return "T_VariableShowStmt";
	case duckdb_libpgquery::T_PGVariableShowSelectStmt:
		return "T_VariableShowSelectStmt";
	case duckdb_libpgquery::T_PGDiscardStmt:
		return "T_DiscardStmt";
	case duckdb_libpgquery::T_PGCreateTrigStmt:
		return "T_CreateTrigStmt";
	case duckdb_libpgquery::T_PGCreatePLangStmt:
		return "T_CreatePLangStmt";
	case duckdb_libpgquery::T_PGCreateRoleStmt:
		return "T_CreateRoleStmt";
	case duckdb_libpgquery::T_PGAlterRoleStmt:
		return "T_AlterRoleStmt";
	case duckdb_libpgquery::T_PGDropRoleStmt:
		return "T_DropRoleStmt";
	case duckdb_libpgquery::T_PGLockStmt:
		return "T_LockStmt";
	case duckdb_libpgquery::T_PGConstraintsSetStmt:
		return "T_ConstraintsSetStmt";
	case duckdb_libpgquery::T_PGReindexStmt:
		return "T_ReindexStmt";
	case duckdb_libpgquery::T_PGCheckPointStmt:
		return "T_CheckPointStmt";
	case duckdb_libpgquery::T_PGCreateSchemaStmt:
		return "T_CreateSchemaStmt";
	case duckdb_libpgquery::T_PGAlterDatabaseStmt:
		return "T_AlterDatabaseStmt";
	case duckdb_libpgquery::T_PGAlterDatabaseSetStmt:
		return "T_AlterDatabaseSetStmt";
	case duckdb_libpgquery::T_PGAlterRoleSetStmt:
		return "T_AlterRoleSetStmt";
	case duckdb_libpgquery::T_PGCreateConversionStmt:
		return "T_CreateConversionStmt";
	case duckdb_libpgquery::T_PGCreateCastStmt:
		return "T_CreateCastStmt";
	case duckdb_libpgquery::T_PGCreateOpClassStmt:
		return "T_CreateOpClassStmt";
	case duckdb_libpgquery::T_PGCreateOpFamilyStmt:
		return "T_CreateOpFamilyStmt";
	case duckdb_libpgquery::T_PGAlterOpFamilyStmt:
		return "T_AlterOpFamilyStmt";
	case duckdb_libpgquery::T_PGPrepareStmt:
		return "T_PrepareStmt";
	case duckdb_libpgquery::T_PGExecuteStmt:
		return "T_ExecuteStmt";
	case duckdb_libpgquery::T_PGCallStmt:
		return "T_CallStmt";
	case duckdb_libpgquery::T_PGDeallocateStmt:
		return "T_DeallocateStmt";
	case duckdb_libpgquery::T_PGDeclareCursorStmt:
		return "T_DeclareCursorStmt";
	case duckdb_libpgquery::T_PGCreateTableSpaceStmt:
		return "T_CreateTableSpaceStmt";
	case duckdb_libpgquery::T_PGDropTableSpaceStmt:
		return "T_DropTableSpaceStmt";
	case duckdb_libpgquery::T_PGAlterObjectDependsStmt:
		return "T_AlterObjectDependsStmt";
	case duckdb_libpgquery::T_PGAlterObjectSchemaStmt:
		return "T_AlterObjectSchemaStmt";
	case duckdb_libpgquery::T_PGAlterOwnerStmt:
		return "T_AlterOwnerStmt";
	case duckdb_libpgquery::T_PGAlterOperatorStmt:
		return "T_AlterOperatorStmt";
	case duckdb_libpgquery::T_PGDropOwnedStmt:
		return "T_DropOwnedStmt";
	case duckdb_libpgquery::T_PGReassignOwnedStmt:
		return "T_ReassignOwnedStmt";
	case duckdb_libpgquery::T_PGCompositeTypeStmt:
		return "T_CompositeTypeStmt";
	case duckdb_libpgquery::T_PGCreateTypeStmt:
		return "T_CreateTypeStmt";
	case duckdb_libpgquery::T_PGCreateRangeStmt:
		return "T_CreateRangeStmt";
	case duckdb_libpgquery::T_PGAlterEnumStmt:
		return "T_AlterEnumStmt";
	case duckdb_libpgquery::T_PGAlterTSDictionaryStmt:
		return "T_AlterTSDictionaryStmt";
	case duckdb_libpgquery::T_PGAlterTSConfigurationStmt:
		return "T_AlterTSConfigurationStmt";
	case duckdb_libpgquery::T_PGCreateFdwStmt:
		return "T_CreateFdwStmt";
	case duckdb_libpgquery::T_PGAlterFdwStmt:
		return "T_AlterFdwStmt";
	case duckdb_libpgquery::T_PGCreateForeignServerStmt:
		return "T_CreateForeignServerStmt";
	case duckdb_libpgquery::T_PGAlterForeignServerStmt:
		return "T_AlterForeignServerStmt";
	case duckdb_libpgquery::T_PGCreateUserMappingStmt:
		return "T_CreateUserMappingStmt";
	case duckdb_libpgquery::T_PGAlterUserMappingStmt:
		return "T_AlterUserMappingStmt";
	case duckdb_libpgquery::T_PGDropUserMappingStmt:
		return "T_DropUserMappingStmt";
	case duckdb_libpgquery::T_PGAlterTableSpaceOptionsStmt:
		return "T_AlterTableSpaceOptionsStmt";
	case duckdb_libpgquery::T_PGAlterTableMoveAllStmt:
		return "T_AlterTableMoveAllStmt";
	case duckdb_libpgquery::T_PGSecLabelStmt:
		return "T_SecLabelStmt";
	case duckdb_libpgquery::T_PGCreateForeignTableStmt:
		return "T_CreateForeignTableStmt";
	case duckdb_libpgquery::T_PGImportForeignSchemaStmt:
		return "T_ImportForeignSchemaStmt";
	case duckdb_libpgquery::T_PGCreateExtensionStmt:
		return "T_CreateExtensionStmt";
	case duckdb_libpgquery::T_PGAlterExtensionStmt:
		return "T_AlterExtensionStmt";
	case duckdb_libpgquery::T_PGAlterExtensionContentsStmt:
		return "T_AlterExtensionContentsStmt";
	case duckdb_libpgquery::T_PGCreateEventTrigStmt:
		return "T_CreateEventTrigStmt";
	case duckdb_libpgquery::T_PGAlterEventTrigStmt:
		return "T_AlterEventTrigStmt";
	case duckdb_libpgquery::T_PGRefreshMatViewStmt:
		return "T_RefreshMatViewStmt";
	case duckdb_libpgquery::T_PGReplicaIdentityStmt:
		return "T_ReplicaIdentityStmt";
	case duckdb_libpgquery::T_PGAlterSystemStmt:
		return "T_AlterSystemStmt";
	case duckdb_libpgquery::T_PGCreatePolicyStmt:
		return "T_CreatePolicyStmt";
	case duckdb_libpgquery::T_PGAlterPolicyStmt:
		return "T_AlterPolicyStmt";
	case duckdb_libpgquery::T_PGCreateTransformStmt:
		return "T_CreateTransformStmt";
	case duckdb_libpgquery::T_PGCreateAmStmt:
		return "T_CreateAmStmt";
	case duckdb_libpgquery::T_PGCreatePublicationStmt:
		return "T_CreatePublicationStmt";
	case duckdb_libpgquery::T_PGAlterPublicationStmt:
		return "T_AlterPublicationStmt";
	case duckdb_libpgquery::T_PGCreateSubscriptionStmt:
		return "T_CreateSubscriptionStmt";
	case duckdb_libpgquery::T_PGAlterSubscriptionStmt:
		return "T_AlterSubscriptionStmt";
	case duckdb_libpgquery::T_PGDropSubscriptionStmt:
		return "T_DropSubscriptionStmt";
	case duckdb_libpgquery::T_PGCreateStatsStmt:
		return "T_CreateStatsStmt";
	case duckdb_libpgquery::T_PGAlterCollationStmt:
		return "T_AlterCollationStmt";
	case duckdb_libpgquery::T_PGAExpr:
		return "TAExpr";
	case duckdb_libpgquery::T_PGColumnRef:
		return "T_ColumnRef";
	case duckdb_libpgquery::T_PGParamRef:
		return "T_ParamRef";
	case duckdb_libpgquery::T_PGAConst:
		return "TAConst";
	case duckdb_libpgquery::T_PGFuncCall:
		return "T_FuncCall";
	case duckdb_libpgquery::T_PGAStar:
		return "TAStar";
	case duckdb_libpgquery::T_PGAIndices:
		return "TAIndices";
	case duckdb_libpgquery::T_PGAIndirection:
		return "TAIndirection";
	case duckdb_libpgquery::T_PGAArrayExpr:
		return "TAArrayExpr";
	case duckdb_libpgquery::T_PGResTarget:
		return "T_ResTarget";
	case duckdb_libpgquery::T_PGMultiAssignRef:
		return "T_MultiAssignRef";
	case duckdb_libpgquery::T_PGTypeCast:
		return "T_TypeCast";
	case duckdb_libpgquery::T_PGCollateClause:
		return "T_CollateClause";
	case duckdb_libpgquery::T_PGSortBy:
		return "T_SortBy";
	case duckdb_libpgquery::T_PGWindowDef:
		return "T_WindowDef";
	case duckdb_libpgquery::T_PGRangeSubselect:
		return "T_RangeSubselect";
	case duckdb_libpgquery::T_PGRangeFunction:
		return "T_RangeFunction";
	case duckdb_libpgquery::T_PGRangeTableSample:
		return "T_RangeTableSample";
	case duckdb_libpgquery::T_PGRangeTableFunc:
		return "T_RangeTableFunc";
	case duckdb_libpgquery::T_PGRangeTableFuncCol:
		return "T_RangeTableFuncCol";
	case duckdb_libpgquery::T_PGTypeName:
		return "T_TypeName";
	case duckdb_libpgquery::T_PGColumnDef:
		return "T_ColumnDef";
	case duckdb_libpgquery::T_PGIndexElem:
		return "T_IndexElem";
	case duckdb_libpgquery::T_PGConstraint:
		return "T_Constraint";
	case duckdb_libpgquery::T_PGDefElem:
		return "T_DefElem";
	case duckdb_libpgquery::T_PGRangeTblEntry:
		return "T_RangeTblEntry";
	case duckdb_libpgquery::T_PGRangeTblFunction:
		return "T_RangeTblFunction";
	case duckdb_libpgquery::T_PGTableSampleClause:
		return "T_TableSampleClause";
	case duckdb_libpgquery::T_PGWithCheckOption:
		return "T_WithCheckOption";
	case duckdb_libpgquery::T_PGSortGroupClause:
		return "T_SortGroupClause";
	case duckdb_libpgquery::T_PGGroupingSet:
		return "T_GroupingSet";
	case duckdb_libpgquery::T_PGWindowClause:
		return "T_WindowClause";
	case duckdb_libpgquery::T_PGObjectWithArgs:
		return "T_ObjectWithArgs";
	case duckdb_libpgquery::T_PGAccessPriv:
		return "T_AccessPriv";
	case duckdb_libpgquery::T_PGCreateOpClassItem:
		return "T_CreateOpClassItem";
	case duckdb_libpgquery::T_PGTableLikeClause:
		return "T_TableLikeClause";
	case duckdb_libpgquery::T_PGFunctionParameter:
		return "T_FunctionParameter";
	case duckdb_libpgquery::T_PGLockingClause:
		return "T_LockingClause";
	case duckdb_libpgquery::T_PGRowMarkClause:
		return "T_RowMarkClause";
	case duckdb_libpgquery::T_PGXmlSerialize:
		return "T_XmlSerialize";
	case duckdb_libpgquery::T_PGWithClause:
		return "T_WithClause";
	case duckdb_libpgquery::T_PGInferClause:
		return "T_InferClause";
	case duckdb_libpgquery::T_PGOnConflictClause:
		return "T_OnConflictClause";
	case duckdb_libpgquery::T_PGCommonTableExpr:
		return "T_CommonTableExpr";
	case duckdb_libpgquery::T_PGRoleSpec:
		return "T_RoleSpec";
	case duckdb_libpgquery::T_PGTriggerTransition:
		return "T_TriggerTransition";
	case duckdb_libpgquery::T_PGPartitionElem:
		return "T_PartitionElem";
	case duckdb_libpgquery::T_PGPartitionSpec:
		return "T_PartitionSpec";
	case duckdb_libpgquery::T_PGPartitionBoundSpec:
		return "T_PartitionBoundSpec";
	case duckdb_libpgquery::T_PGPartitionRangeDatum:
		return "T_PartitionRangeDatum";
	case duckdb_libpgquery::T_PGPartitionCmd:
		return "T_PartitionCmd";
	case duckdb_libpgquery::T_PGIdentifySystemCmd:
		return "T_IdentifySystemCmd";
	case duckdb_libpgquery::T_PGBaseBackupCmd:
		return "T_BaseBackupCmd";
	case duckdb_libpgquery::T_PGCreateReplicationSlotCmd:
		return "T_CreateReplicationSlotCmd";
	case duckdb_libpgquery::T_PGDropReplicationSlotCmd:
		return "T_DropReplicationSlotCmd";
	case duckdb_libpgquery::T_PGStartReplicationCmd:
		return "T_StartReplicationCmd";
	case duckdb_libpgquery::T_PGTimeLineHistoryCmd:
		return "T_TimeLineHistoryCmd";
	case duckdb_libpgquery::T_PGSQLCmd:
		return "T_SQLCmd";
	case duckdb_libpgquery::T_PGTriggerData:
		return "T_TriggerData";
	case duckdb_libpgquery::T_PGEventTriggerData:
		return "T_EventTriggerData";
	case duckdb_libpgquery::T_PGReturnSetInfo:
		return "T_ReturnSetInfo";
	case duckdb_libpgquery::T_PGWindowObjectData:
		return "T_WindowObjectData";
	case duckdb_libpgquery::T_PGTIDBitmap:
		return "T_TIDBitmap";
	case duckdb_libpgquery::T_PGInlineCodeBlock:
		return "T_InlineCodeBlock";
	case duckdb_libpgquery::T_PGFdwRoutine:
		return "T_FdwRoutine";
	case duckdb_libpgquery::T_PGIndexAmRoutine:
		return "T_IndexAmRoutine";
	case duckdb_libpgquery::T_PGTsmRoutine:
		return "T_TsmRoutine";
	case duckdb_libpgquery::T_PGForeignKeyCacheInfo:
		return "T_ForeignKeyCacheInfo";
	case duckdb_libpgquery::T_PGAttachStmt:
		return "T_PGAttachStmt";
	case duckdb_libpgquery::T_PGUseStmt:
		return "T_PGUseStmt";
	default:
		return "(UNKNOWN)";
	}
}